

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * RemapInstructionArgument
                    (ExpressionContext *ctx,VmModule *module,VmValue *argOrig,
                    SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>
                    *variableRemap,
                    SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U>
                    *instructionRemap)

{
  SmallArray<VmConstant_*,_8U> *this;
  uint uVar1;
  VmBlock *pVVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  VmValueType VVar5;
  int iVar6;
  VmConstant **ppVVar7;
  undefined4 extraout_var;
  VmInstruction **ppVVar8;
  VmModule *pVVar9;
  bool bVar10;
  VariableData *containerOrig;
  VmBlock *local_38;
  
  if ((argOrig == (VmValue *)0x0) || (pVVar9 = (VmModule *)argOrig, argOrig->typeID != 1)) {
    pVVar9 = (VmModule *)0x0;
  }
  if (pVVar9 == (VmModule *)0x0) {
    if ((argOrig == (VmValue *)0x0) || (local_38 = (VmBlock *)argOrig, argOrig->typeID != 2)) {
      local_38 = (VmBlock *)0x0;
    }
    if (local_38 == (VmBlock *)0x0) {
      if ((argOrig == (VmValue *)0x0) || (argOrig->typeID != 4)) {
        argOrig = (VmValue *)0x0;
      }
      bVar10 = (VmModule *)argOrig == (VmModule *)0x0;
    }
    else {
      ppVVar8 = SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U>::find
                          (instructionRemap,(VmInstruction **)&local_38);
      if (ppVVar8 == (VmInstruction **)0x0) {
        __assert_fail("remap",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x19a9,
                      "VmValue *RemapInstructionArgument(ExpressionContext &, VmModule *, VmValue *, const SmallDenseMap<VariableData *, VmConstant *, VariableDataHasher, 16> &, const SmallDenseMap<VmInstruction *, VmInstruction *, VmInstructionHasher, 16> &)"
                     );
      }
      argOrig = &(*ppVVar8)->super_VmValue;
      bVar10 = false;
    }
  }
  else {
    local_38 = (pVVar9->loopInfo).little[8].breakBlock;
    if (local_38 == (VmBlock *)0x0) {
      bVar10 = true;
    }
    else {
      ppVVar7 = SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>::find
                          (variableRemap,(VariableData **)&local_38);
      bVar10 = ppVVar7 == (VmConstant **)0x0;
      if (!bVar10) {
        if (*(char *)((long)&(pVVar9->loopInfo).little[8].continueBlock + 1) == '\x01') {
          iVar6 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0xd8);
          module = (VmModule *)CONCAT44(extraout_var,iVar6);
          pVVar2 = (VmBlock *)ctx->allocator;
          VVar5 = (argOrig->type).type;
          uVar1 = (argOrig->type).size;
          pTVar4 = (argOrig->type).structType;
          pSVar3 = *(SynBase **)&pVVar9->skipFunctionDefinitions;
          *(uint *)&(module->functions).head = 1;
          *(VmValueType *)&(module->functions).tail = VVar5;
          *(uint *)((long)&(module->functions).tail + 4) = uVar1;
          *(TypeBase **)&module->vmGlobalCodeStart = pTVar4;
          *(SynBase **)&module->skipFunctionDefinitions = pSVar3;
          ((InplaceStr *)&module->currentFunction)->begin = (char *)0x0;
          module->currentBlock = (VmBlock *)0x0;
          (module->loopInfo).little[4].continueBlock = pVVar2;
          ((SmallArray<VmValue_*,_8U> *)&(module->loopInfo).count)->data =
               (VmValue **)&(module->loopInfo).little[0].continueBlock;
          (module->loopInfo).little[0].breakBlock = (VmBlock *)0x800000000;
          *(undefined4 *)&(module->loopInfo).data = 0x10000;
          *(bool *)((long)&(module->loopInfo).data + 4) = false;
          ((VmValue *)&module->code)->_vptr_VmValue = (_func_int **)&PTR__VmValue_0022ad48;
          *(undefined4 *)&(module->loopInfo).little[5].breakBlock = 0;
          (module->loopInfo).little[5].continueBlock = (VmBlock *)0x0;
          (module->loopInfo).little[6].breakBlock = (VmBlock *)0x0;
          (module->loopInfo).little[6].continueBlock = (VmBlock *)0x0;
          (module->loopInfo).little[7].breakBlock = (VmBlock *)0x0;
          (module->loopInfo).little[7].continueBlock = (VmBlock *)0x0;
          (module->loopInfo).little[8].breakBlock = (VmBlock *)0x0;
          *(undefined2 *)&(module->loopInfo).little[8].continueBlock = 0;
          *(undefined4 *)&(module->loopInfo).little[5].breakBlock =
               *(undefined4 *)&(pVVar9->loopInfo).little[5].breakBlock;
          pVVar2 = (VmBlock *)(*ppVVar7)->container;
          (module->loopInfo).little[8].breakBlock = pVVar2;
          *(undefined1 *)((long)&(module->loopInfo).little[8].continueBlock + 1) = 1;
          this = (SmallArray<VmConstant_*,_8U> *)&(pVVar2->super_VmValue).users.count;
          uVar1 = *(uint *)(pVVar2->super_VmValue).users.little;
          if (uVar1 == *(uint *)((long)(pVVar2->super_VmValue).users.little + 4)) {
            SmallArray<VmConstant_*,_8U>::grow(this,uVar1);
          }
          ppVVar7 = this->data;
          if (ppVVar7 == (VmConstant **)0x0) {
            __assert_fail("data",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x162,
                          "void SmallArray<VmConstant *, 8>::push_back(const T &) [T = VmConstant *, N = 8]"
                         );
          }
          uVar1 = *(uint *)(pVVar2->super_VmValue).users.little;
          *(uint *)(pVVar2->super_VmValue).users.little = uVar1 + 1;
          ppVVar7[uVar1] = (VmConstant *)module;
          if ((VmBlock *)((InplaceStr *)&pVVar9->currentFunction)->begin != pVVar9->currentBlock) {
            pVVar2 = pVVar9->currentBlock;
            ((InplaceStr *)&module->currentFunction)->begin =
                 ((InplaceStr *)&pVVar9->currentFunction)->begin;
            module->currentBlock = pVVar2;
          }
        }
        else {
          module = (VmModule *)
                   CreateConstantPointer
                             (ctx->allocator,*(SynBase **)&pVVar9->skipFunctionDefinitions,
                              *(int *)&(pVVar9->loopInfo).little[5].breakBlock,(*ppVVar7)->container
                              ,(argOrig->type).structType,true);
          if ((VmBlock *)((InplaceStr *)&pVVar9->currentFunction)->begin != pVVar9->currentBlock) {
            pVVar2 = pVVar9->currentBlock;
            ((InplaceStr *)&module->currentFunction)->begin =
                 ((InplaceStr *)&pVVar9->currentFunction)->begin;
            module->currentBlock = pVVar2;
          }
        }
      }
    }
    argOrig = (VmValue *)module;
    if (bVar10) {
      argOrig = (VmValue *)pVVar9;
    }
    bVar10 = false;
  }
  if (bVar10) {
    __assert_fail("!\"unexpected type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x19b2,
                  "VmValue *RemapInstructionArgument(ExpressionContext &, VmModule *, VmValue *, const SmallDenseMap<VariableData *, VmConstant *, VariableDataHasher, 16> &, const SmallDenseMap<VmInstruction *, VmInstruction *, VmInstructionHasher, 16> &)"
                 );
  }
  return (VmValue *)(VmModule *)argOrig;
}

Assistant:

VmValue* RemapInstructionArgument(ExpressionContext &ctx, VmModule *module, VmValue *argOrig, const SmallDenseMap<VariableData*, VmConstant*, VariableDataHasher, 16> &variableRemap, const SmallDenseMap<VmInstruction*, VmInstruction*, VmInstructionHasher, 16> &instructionRemap)
{
	if(VmConstant *argOrigConstant = getType<VmConstant>(argOrig))
	{
		if(VariableData *containerOrig = argOrigConstant->container)
		{
			if(VmConstant **remap = variableRemap.find(containerOrig))
			{
				if(argOrigConstant->isReference)
				{
					VmConstant *reference = new (module->get<VmConstant>()) VmConstant(ctx.allocator, argOrig->type, argOrigConstant->source);

					reference->iValue = argOrigConstant->iValue;
					reference->container = (*remap)->container;
					reference->isReference = true;

					reference->container->users.push_back(reference);

					if(!argOrigConstant->comment.empty())
						reference->comment = argOrigConstant->comment;

					return reference;
				}

				VmConstant *ptr = CreateConstantPointer(ctx.allocator, argOrigConstant->source, argOrigConstant->iValue, (*remap)->container, argOrig->type.structType, true);

				if(!argOrigConstant->comment.empty())
					ptr->comment = argOrigConstant->comment;

				return ptr;
			}
		}

		return argOrigConstant;
	}
	else if(VmInstruction *argOrigInst = getType<VmInstruction>(argOrig))
	{
		VmInstruction **remap = instructionRemap.find(argOrigInst);

		assert(remap); // Has to be remapped

		return *remap;
	}
	else if(VmFunction *argOrigFunction = getType<VmFunction>(argOrig))
	{
		return argOrigFunction;
	}

	assert(!"unexpected type");

	return NULL;
}